

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O3

void LoadBookHashTable(void)

{
  _Alloc_hider fen;
  size_type sVar1;
  bool bVar2;
  char *pcVar3;
  long *plVar4;
  long *plVar5;
  string line;
  int buff_p;
  string side;
  string move_s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_108;
  int local_e4;
  char *local_e0;
  char *local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  BookHashTable = (BookHashNode *)operator_new__(0x1800000);
  memset(BookHashTable,0,0x1800000);
  pcVar3 = (char *)operator_new__(0x1000000);
  memset(pcVar3,0,0x1000000);
  local_e4 = 0;
  local_e0 = pcVar3;
  decompress(pcVar3);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar2 = getLine(local_e0,&local_e4,&local_108);
    if (!bVar2) break;
    BookZobristKey = ZobristKey;
    BookZobristKeyCheck = ZobristKeyCheck;
    pcVar3 = (char *)operator_new__((ulong)(local_108._M_string_length + 1));
    strcpy(pcVar3,local_108._M_dataplus._M_p);
    local_d8 = pcVar3;
    pcVar3 = strtok(pcVar3,":");
    std::__cxx11::string::string((string *)&local_90,pcVar3,(allocator *)local_b0);
    pcVar3 = strtok((char *)0x0,anon_var_dwarf_1b5bc + 0x25);
    sVar1 = local_108._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)sVar1,(ulong)pcVar3);
    pcVar3 = strtok((char *)0x0,anon_var_dwarf_1b5bc + 0x25);
    std::__cxx11::string::string((string *)local_b0,pcVar3,(allocator *)&local_d0);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_108._M_dataplus._M_p,
               (char *)(local_108._M_string_length + (long)local_108._M_dataplus._M_p));
    std::__cxx11::string::append((char *)local_70);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_b0[0]);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_c0 = *plVar5;
      lStack_b8 = plVar4[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*plVar4;
    }
    local_c8 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    operator_delete(local_d8);
    fen._M_p = local_108._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_90,local_90 + local_88);
    FENToHash(fen._M_p,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
  }
  operator_delete__(local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoadBookHashTable(){
    BookHashTable = new BookHashNode[BOOK_HASHTABLE_SIZE];
    memset(BookHashTable, 0, BOOK_HASHTABLE_SIZE * sizeof(BookHashNode));

    char* buff = new char[1<<24];
    memset(buff, 0, (1<<24) * sizeof(char));
    int buff_p = 0;
    decompress(buff);

    string line;
    while(getLine(buff, buff_p, line)){
        InitBookZobrist();
        char* temp = new char[line.size() + 1];
		strcpy(temp, line.c_str());
        string move_s = strtok(temp, ":");

		line = strtok(NULL, " ");
		string side = strtok(NULL, " ");
		line = line + " " + side;       // line存放FEN串
        delete temp;
        FENToHash(line.c_str(), move_s);                 // 将对应局面存入哈希表
    }
    delete[] buff;
}